

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_timings::test_method(test_solvers_timings *this)

{
  ostream *poVar1;
  undefined **local_90;
  undefined1 local_88;
  undefined8 *local_80;
  char *local_78;
  double hungarian_timing;
  double brute_force_timing;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Brute force method:");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_90 = (undefined **)
             hungarian_algorithm::
             solveBruteForce<int,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  brute_force_timing =
       test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
                 ((_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                   **)&local_90,10);
  poVar1 = std::operator<<((ostream *)&std::cout,"Hungarian method:");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_90 = (undefined **)
             hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  hungarian_timing =
       test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
                 ((_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                   **)&local_90,10);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1a4);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_00124b80;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abuchegger[P]hungarian-algorithm-cpp/test.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,double,double>
            (&local_90,&local_60,0x1a4,1,4,&hungarian_timing,"hungarian_timing",&brute_force_timing,
             "brute_force_timing");
  local_90 = (undefined **)
             hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
            ((_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
              **)&local_90,100);
  local_90 = (undefined **)
             hungarian_algorithm::
             solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ;
  test_solver_timing<int(*)(boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&)>
            ((_func_int_matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
              **)&local_90,200);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_timings)
{
  // These are informative only, and to check for any severe errors (segfaults, endless loops, ...):
  typedef int SolvingFunction(const ublas::matrix<int>&, const std::size_t, const std::size_t,
                              std::vector<std::size_t>&);
  std::cout << "Brute force method:" << std::endl;
  const double brute_force_timing = test_solver_timing(
    static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), 10);
  std::cout << "Hungarian method:" << std::endl;
  const double hungarian_timing = test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 10);
  BOOST_CHECK_LT(hungarian_timing, brute_force_timing);
  test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 100);
  test_solver_timing(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), 200);
}